

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal32.c
# Opt level: O2

decimal32 * decimal32Canonical(decimal32 *result,decimal32 *d32)

{
  decNumber_conflict1 dn;
  decContext dc;
  
  decContextDefault(&dc,0x20);
  decimal32ToNumber(d32,&dn);
  decimal32FromNumber(result,&dn,&dc);
  return result;
}

Assistant:

decimal32 * decimal32Canonical(decimal32 *result, const decimal32 *d32) {
  decNumber dn;				/* work */
  decContext dc;			/* .. */
  decContextDefault(&dc, DEC_INIT_DECIMAL32);
  decimal32ToNumber(d32, &dn);
  decimal32FromNumber(result, &dn, &dc);/* result will now be canonical */
  return result;
  }